

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_enc_Utf32sDfa.h
# Opt level: O0

uint_t __thiscall axl::enc::Utf32sDfaBase<false>::decode(Utf32sDfaBase<false> *this,uchar_t c)

{
  uint uVar1;
  uint local_24;
  uint_t nextState;
  uint_t prevState;
  uchar_t c_local;
  Utf32sDfaBase<false> *this_local;
  
  uVar1 = (this->super_UtfDfa<axl::enc::Utf32sDfaBase<false>,_axl::enc::Utf32sDfaRoot>).m_state & 3;
  if (uVar1 == 0) {
    local_24 = (uint)c;
  }
  else {
    local_24 = (this->super_UtfDfa<axl::enc::Utf32sDfaBase<false>,_axl::enc::Utf32sDfaRoot>).m_cp |
               (uint)c << (sbyte)(uVar1 << 3);
  }
  (this->super_UtfDfa<axl::enc::Utf32sDfaBase<false>,_axl::enc::Utf32sDfaRoot>).m_cp = local_24;
  (this->super_UtfDfa<axl::enc::Utf32sDfaBase<false>,_axl::enc::Utf32sDfaRoot>).m_state = uVar1 + 1;
  return uVar1 + 1;
}

Assistant:

uint_t
Utf32sDfaBase<IsBigEndian>::decode(uchar_t c) {
	uint_t prevState = this->m_state & 3;
	uint_t nextState = prevState + 1;

	if (IsBigEndian)
		this->m_cp = prevState ? this->m_cp | (c << ((3 - prevState) << 3)) : c << 24;
	else
		this->m_cp = prevState ? this->m_cp | (c << (prevState << 3)) : c;

	return this->m_state = nextState;
}